

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::internal::ParseStringFlag<std::__cxx11::string>
               (char *str,char *flag,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  char *pcVar1;
  char *__s;
  
  __s = ParseFlagValue(str,flag,false);
  if (__s != (char *)0x0) {
    pcVar1 = (char *)value->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)value,0,pcVar1,(ulong)__s);
  }
  return __s != (char *)0x0;
}

Assistant:

static bool ParseStringFlag(const char* str, const char* flag, String* value) {
  // Gets the value of the flag as a string.
  const char* const value_str = ParseFlagValue(str, flag, false);

  // Aborts if the parsing failed.
  if (value_str == NULL) return false;

  // Sets *value to the value of the flag.
  *value = value_str;
  return true;
}